

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::advance(QGraphicsScene *this)

{
  bool bVar1;
  const_iterator o;
  QGraphicsItem **ppQVar2;
  QList<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range2;
  int i;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QGraphicsItem_*> items_;
  undefined1 **in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar3;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (uVar3 = 0; (int)uVar3 < 2; uVar3 = uVar3 + 1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    items((QGraphicsScene *)CONCAT44(uVar3,in_stack_ffffffffffffffb8),
          (SortOrder)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    in_stack_ffffffffffffffb0 = &local_20;
    local_28.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QGraphicsItem_*>::begin(in_RDI);
    o = QList<QGraphicsItem_*>::end(in_RDI);
    while( true ) {
      bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_28,o);
      if (!bVar1) break;
      ppQVar2 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_28);
      (*(*ppQVar2)->_vptr_QGraphicsItem[2])(*ppQVar2,(ulong)uVar3);
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_28);
    }
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9cdd75);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::advance()
{
    for (int i = 0; i < 2; ++i) {
        const auto items_ = items();
        for (QGraphicsItem *item : items_)
            item->advance(i);
    }
}